

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O1

void av1_compute_stats_highbd_avx2
               (int wiener_win,uint8_t *dgd8,uint8_t *src8,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,aom_bit_depth_t bit_depth)

{
  undefined1 (*pauVar1) [16];
  long *plVar2;
  undefined4 uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 (*pauVar17) [32];
  int iVar18;
  undefined1 (*pauVar19) [32];
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 *puVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int *piVar29;
  long *plVar30;
  int64_t *piVar31;
  long lVar32;
  ulong uVar33;
  int *piVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int64_t *piVar42;
  ulong uVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  int64_t M_int [7] [7];
  int64_t H_int [49] [56];
  long local_5918;
  long local_5910;
  long local_5908;
  long local_5900;
  int local_58a0 [24];
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 local_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  undefined4 local_57e0;
  long local_57c0 [52];
  undefined1 local_5620 [288];
  undefined1 local_5500 [128];
  undefined1 local_5480 [21584];
  
  if (wiener_win == 5) {
    lVar16 = (long)dgd8 * 2;
    if (v_start < v_end) {
      lVar36 = (long)v_start;
      lVar41 = lVar16 + dgd_stride * lVar36 * 2;
      uVar10 = 0;
      do {
        lVar20 = (long)h_start;
        if (h_start < h_end) {
          do {
            uVar10 = uVar10 + *(ushort *)(lVar41 + lVar20 * 2);
            lVar20 = lVar20 + 1;
          } while (h_end != lVar20);
        }
        lVar36 = lVar36 + 1;
        lVar41 = lVar41 + (long)dgd_stride * 2;
      } while (lVar36 != v_end);
    }
    else {
      uVar10 = 0;
    }
    uVar43 = (ulong)((v_end - v_start) * (h_end - h_start));
    local_57c0[0x14] = 0;
    local_57c0[0x15] = 0;
    local_57c0[0x16] = 0;
    local_57c0[0x17] = 0;
    local_57c0[0x10] = 0;
    local_57c0[0x11] = 0;
    local_57c0[0x12] = 0;
    local_57c0[0x13] = 0;
    local_57c0[0xc] = 0;
    local_57c0[0xd] = 0;
    local_57c0[0xe] = 0;
    local_57c0[0xf] = 0;
    local_57c0[8] = 0;
    local_57c0[9] = 0;
    local_57c0[10] = 0;
    local_57c0[0xb] = 0;
    local_57c0[4] = 0;
    local_57c0[5] = 0;
    local_57c0[6] = 0;
    local_57c0[7] = 0;
    local_57c0[0] = 0;
    local_57c0[1] = 0;
    local_57c0[2] = 0;
    local_57c0[3] = 0;
    local_57c0[0x18] = 0;
    memset(local_5620,0,8000);
    local_58a0[0x10] = 0;
    local_58a0[0x11] = 0;
    local_58a0[0x12] = 0;
    local_58a0[0x13] = 0;
    local_58a0[0x14] = 0;
    local_58a0[0x15] = 0;
    local_58a0[0x16] = 0;
    local_58a0[0x17] = 0;
    local_58a0[8] = 0;
    local_58a0[9] = 0;
    local_58a0[10] = 0;
    local_58a0[0xb] = 0;
    local_58a0[0xc] = 0;
    local_58a0[0xd] = 0;
    local_58a0[0xe] = 0;
    local_58a0[0xf] = 0;
    local_58a0[0] = 0;
    local_58a0[1] = 0;
    local_58a0[2] = 0;
    local_58a0[3] = 0;
    local_58a0[4] = 0;
    local_58a0[5] = 0;
    local_58a0[6] = 0;
    local_58a0[7] = 0;
    local_5840 = (ulong)local_5840._4_4_ << 0x20;
    iVar18 = 0;
    if (v_start < v_end) {
      lVar36 = (long)(dgd_stride * 2);
      lVar11 = (long)dgd_stride;
      lVar20 = (long)(dgd_stride * 3);
      lVar39 = (long)(dgd_stride << 2);
      lVar12 = (long)v_start;
      local_5900 = (long)h_start * 2 + lVar11 * lVar12 * 2 + lVar36 * -2 + -4 + lVar16;
      local_5908 = lVar11 * lVar12 * 2 + lVar36 * -2 + lVar16 + -4;
      lVar41 = lVar11 * 2;
      iVar18 = 0;
      do {
        iVar26 = (int)lVar12;
        iVar8 = v_end - iVar26;
        if (iVar8 != 0 && iVar26 <= v_end) {
          if (0x3f < iVar8) {
            iVar8 = 0x40;
          }
          lVar27 = lVar12;
          lVar32 = local_5900;
          lVar15 = local_5908;
          do {
            lVar22 = lVar16 + lVar36 * -2 + -4 + lVar27 * lVar11 * 2;
            lVar38 = (long)src8 * 2 + lVar27 * src_stride * 2;
            uVar33 = (long)h_start;
            lVar14 = lVar32;
            if (h_start < (int)(h_end & 0xfffffffeU)) {
              do {
                uVar4 = *(ushort *)(lVar38 + uVar33 * 2);
                uVar5 = *(ushort *)(lVar38 + 2 + uVar33 * 2);
                pauVar1 = (undefined1 (*) [16])(lVar22 + uVar33 * 2);
                auVar46._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + 8) + ZEXT116(1) * *pauVar1;
                auVar46._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + 8);
                auVar46 = vpshufb_avx2(auVar46,_DAT_00512200);
                auVar50._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2);
                auVar50._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8);
                auVar50 = vpshufb_avx2(auVar50,_DAT_00512200);
                auVar54._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar36 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar36 * 2);
                auVar54._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar36 * 2 + 8);
                auVar54 = vpshufb_avx2(auVar54,_DAT_00512200);
                auVar58._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2);
                auVar58._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2 + 8);
                auVar58 = vpshufb_avx2(auVar58,_DAT_00512200);
                auVar62._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2);
                auVar62._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2 + 8);
                auVar62 = vpshufb_avx2(auVar62,_DAT_00512200);
                pauVar17 = (undefined1 (*) [32])local_5500;
                piVar29 = local_58a0;
                plVar30 = local_57c0;
                lVar13 = 0;
                lVar37 = lVar14;
                do {
                  lVar21 = 0;
                  pauVar19 = pauVar17;
                  do {
                    uVar6 = *(ushort *)(lVar37 + lVar21);
                    uVar7 = *(ushort *)(lVar37 + 2 + lVar21);
                    piVar34 = (int *)((long)piVar29 + lVar21 * 2);
                    *piVar34 = *piVar34 + (uint)uVar7 + (uint)uVar6;
                    uVar9 = (uint)uVar4;
                    uVar35 = (uint)uVar5;
                    plVar2 = (long *)((long)plVar30 + lVar21 * 4);
                    *plVar2 = *plVar2 + (ulong)(uVar7 * uVar35 + uVar6 * uVar9);
                    uVar3 = *(undefined4 *)(lVar37 + lVar21);
                    auVar66._4_4_ = uVar3;
                    auVar66._0_4_ = uVar3;
                    auVar66._8_4_ = uVar3;
                    auVar66._12_4_ = uVar3;
                    auVar66._16_4_ = uVar3;
                    auVar66._20_4_ = uVar3;
                    auVar66._24_4_ = uVar3;
                    auVar66._28_4_ = uVar3;
                    auVar51 = vpmaddwd_avx2(auVar66,auVar46);
                    auVar47 = vpmovzxdq_avx2(auVar51._0_16_);
                    auVar47 = vpaddq_avx2(auVar47,pauVar19[-9]);
                    pauVar19[-9] = auVar47;
                    auVar47 = vpmovzxdq_avx2(auVar51._16_16_);
                    auVar47 = vpaddq_avx2(auVar47,pauVar19[-8]);
                    pauVar19[-8] = auVar47;
                    auVar51 = vpmaddwd_avx2(auVar66,auVar50);
                    auVar47 = vpmovzxdq_avx2(auVar51._0_16_);
                    auVar47 = vpaddq_avx2(auVar47,pauVar19[-7]);
                    pauVar19[-7] = auVar47;
                    auVar47 = vpmovzxdq_avx2(auVar51._16_16_);
                    auVar47 = vpaddq_avx2(auVar47,pauVar19[-6]);
                    pauVar19[-6] = auVar47;
                    auVar51 = vpmaddwd_avx2(auVar66,auVar54);
                    auVar47 = vpmovzxdq_avx2(auVar51._0_16_);
                    auVar47 = vpaddq_avx2(auVar47,pauVar19[-5]);
                    pauVar19[-5] = auVar47;
                    auVar47 = vpmovzxdq_avx2(auVar51._16_16_);
                    auVar47 = vpaddq_avx2(auVar47,pauVar19[-4]);
                    pauVar19[-4] = auVar47;
                    auVar51 = vpmaddwd_avx2(auVar66,auVar58);
                    auVar47 = vpmovzxdq_avx2(auVar51._0_16_);
                    auVar47 = vpaddq_avx2(auVar47,pauVar19[-3]);
                    pauVar19[-3] = auVar47;
                    auVar47 = vpmovzxdq_avx2(auVar51._16_16_);
                    auVar47 = vpaddq_avx2(auVar47,pauVar19[-2]);
                    pauVar19[-2] = auVar47;
                    auVar51 = vpmaddwd_avx2(auVar66,auVar62);
                    auVar47 = vpmovzxdq_avx2(auVar51._0_16_);
                    auVar47 = vpaddq_avx2(auVar47,pauVar19[-1]);
                    pauVar19[-1] = auVar47;
                    auVar47 = vpmovzxdq_avx2(auVar51._16_16_);
                    auVar47 = vpaddq_avx2(auVar47,*pauVar19);
                    *pauVar19 = auVar47;
                    lVar21 = lVar21 + 2;
                    pauVar19 = pauVar19 + 0x32;
                  } while (lVar21 != 10);
                  lVar13 = lVar13 + 1;
                  plVar30 = plVar30 + 5;
                  piVar29 = piVar29 + 5;
                  lVar37 = lVar37 + lVar41;
                  pauVar17 = pauVar17 + 10;
                } while (lVar13 != 5);
                iVar18 = iVar18 + uVar9 + uVar35;
                uVar33 = uVar33 + 2;
                lVar14 = lVar14 + 4;
              } while ((long)uVar33 < (long)(int)(h_end & 0xfffffffeU));
            }
            else {
              uVar33 = (ulong)(uint)h_start;
            }
            if ((h_end & 1U) != 0) {
              lVar14 = (long)(int)uVar33;
              uVar4 = *(ushort *)(lVar38 + lVar14 * 2);
              pauVar1 = (undefined1 (*) [16])(lVar22 + lVar14 * 2);
              auVar47._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + 8) + ZEXT116(1) * *pauVar1;
              auVar47._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + 8);
              auVar46 = vpshufb_avx2(auVar47,_DAT_00512200);
              auVar51._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2);
              auVar51._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8);
              auVar50 = vpshufb_avx2(auVar51,_DAT_00512200);
              auVar55._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar36 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar36 * 2);
              auVar55._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar36 * 2 + 8);
              auVar54 = vpshufb_avx2(auVar55,_DAT_00512200);
              auVar59._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2);
              auVar59._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2 + 8);
              auVar58 = vpshufb_avx2(auVar59,_DAT_00512200);
              auVar63._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2);
              auVar63._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2 + 8);
              auVar62 = vpshufb_avx2(auVar63,_DAT_00512200);
              lVar22 = lVar15 + lVar14 * 2;
              pauVar17 = (undefined1 (*) [32])local_5500;
              piVar29 = local_58a0;
              plVar30 = local_57c0;
              lVar38 = 0;
              do {
                lVar14 = 0;
                pauVar19 = pauVar17;
                do {
                  uVar5 = *(ushort *)(lVar22 + lVar14);
                  piVar34 = (int *)((long)piVar29 + lVar14 * 2);
                  *piVar34 = *piVar34 + CONCAT22(0,uVar5);
                  uVar9 = (uint)uVar4;
                  plVar2 = (long *)((long)plVar30 + lVar14 * 4);
                  *plVar2 = *plVar2 + (ulong)(uVar5 * uVar9);
                  auVar67._4_2_ = uVar5;
                  auVar67._0_4_ = CONCAT22(0,uVar5);
                  auVar67._6_2_ = 0;
                  auVar67._8_2_ = uVar5;
                  auVar67._10_2_ = 0;
                  auVar67._12_2_ = uVar5;
                  auVar67._14_2_ = 0;
                  auVar67._16_2_ = uVar5;
                  auVar67._18_2_ = 0;
                  auVar67._20_2_ = uVar5;
                  auVar67._22_2_ = 0;
                  auVar67._24_2_ = uVar5;
                  auVar67._26_2_ = 0;
                  auVar67._28_2_ = uVar5;
                  auVar67._30_2_ = 0;
                  auVar51 = vpmaddwd_avx2(auVar67,auVar46);
                  auVar47 = vpmovzxdq_avx2(auVar51._0_16_);
                  auVar47 = vpaddq_avx2(auVar47,pauVar19[-9]);
                  pauVar19[-9] = auVar47;
                  auVar47 = vpmovzxdq_avx2(auVar51._16_16_);
                  auVar47 = vpaddq_avx2(auVar47,pauVar19[-8]);
                  pauVar19[-8] = auVar47;
                  auVar51 = vpmaddwd_avx2(auVar67,auVar50);
                  auVar47 = vpmovzxdq_avx2(auVar51._0_16_);
                  auVar47 = vpaddq_avx2(auVar47,pauVar19[-7]);
                  pauVar19[-7] = auVar47;
                  auVar47 = vpmovzxdq_avx2(auVar51._16_16_);
                  auVar47 = vpaddq_avx2(auVar47,pauVar19[-6]);
                  pauVar19[-6] = auVar47;
                  auVar51 = vpmaddwd_avx2(auVar67,auVar54);
                  auVar47 = vpmovzxdq_avx2(auVar51._0_16_);
                  auVar47 = vpaddq_avx2(auVar47,pauVar19[-5]);
                  pauVar19[-5] = auVar47;
                  auVar47 = vpmovzxdq_avx2(auVar51._16_16_);
                  auVar47 = vpaddq_avx2(auVar47,pauVar19[-4]);
                  pauVar19[-4] = auVar47;
                  auVar51 = vpmaddwd_avx2(auVar67,auVar58);
                  auVar47 = vpmovzxdq_avx2(auVar51._0_16_);
                  auVar47 = vpaddq_avx2(auVar47,pauVar19[-3]);
                  pauVar19[-3] = auVar47;
                  auVar47 = vpmovzxdq_avx2(auVar51._16_16_);
                  auVar47 = vpaddq_avx2(auVar47,pauVar19[-2]);
                  pauVar19[-2] = auVar47;
                  auVar51 = vpmaddwd_avx2(auVar67,auVar62);
                  auVar47 = vpmovzxdq_avx2(auVar51._0_16_);
                  auVar47 = vpaddq_avx2(auVar47,pauVar19[-1]);
                  pauVar19[-1] = auVar47;
                  auVar47 = vpmovzxdq_avx2(auVar51._16_16_);
                  auVar47 = vpaddq_avx2(auVar47,*pauVar19);
                  *pauVar19 = auVar47;
                  lVar14 = lVar14 + 2;
                  pauVar19 = pauVar19 + 0x32;
                } while (lVar14 != 10);
                lVar38 = lVar38 + 1;
                plVar30 = plVar30 + 5;
                piVar29 = piVar29 + 5;
                lVar22 = lVar22 + lVar41;
                pauVar17 = pauVar17 + 10;
              } while (lVar38 != 5);
              iVar18 = iVar18 + uVar9;
            }
            lVar27 = lVar27 + 1;
            lVar32 = lVar32 + lVar41;
            lVar15 = lVar15 + lVar41;
          } while (lVar27 < iVar8 + iVar26);
        }
        lVar12 = lVar12 + 0x40;
        local_5900 = local_5900 + lVar11 * 0x80;
        local_5908 = local_5908 + lVar11 * 0x80;
      } while ((int)lVar12 < v_end);
    }
    lVar16 = 0x10;
    if (bit_depth != AOM_BITS_12) {
      lVar16 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
    }
    uVar10 = uVar10 / uVar43 & 0xffff;
    lVar36 = uVar43 * uVar10 * uVar10;
    lVar41 = 0;
    puVar25 = local_5620;
    do {
      lVar20 = 0;
      puVar24 = puVar25;
      piVar31 = H;
      do {
        iVar8 = local_58a0[lVar41 * 5 + lVar20];
        M[lVar20 * 5 + lVar41] =
             (long)((local_57c0[lVar41 * 5 + lVar20] + lVar36) -
                   ((long)iVar8 + (long)iVar18) * uVar10) / lVar16;
        piVar29 = local_58a0;
        lVar39 = 0;
        puVar23 = puVar24;
        piVar42 = piVar31;
        do {
          lVar11 = 0;
          piVar34 = piVar29;
          do {
            *(long *)((long)piVar42 + lVar11) =
                 (long)((*(long *)(puVar23 + lVar11 * 8) + lVar36) -
                       ((long)*piVar34 + (long)iVar8) * uVar10) / lVar16;
            lVar11 = lVar11 + 8;
            piVar34 = piVar34 + 5;
          } while (lVar11 != 0x28);
          lVar39 = lVar39 + 1;
          piVar42 = piVar42 + 5;
          piVar29 = piVar29 + 1;
          puVar23 = puVar23 + 8;
        } while (lVar39 != 5);
        lVar20 = lVar20 + 1;
        piVar31 = piVar31 + 0x7d;
        puVar24 = puVar24 + 0x640;
      } while (lVar20 != 5);
      lVar41 = lVar41 + 1;
      H = H + 0x19;
      puVar25 = puVar25 + 0x140;
    } while (lVar41 != 5);
  }
  else if (wiener_win == 7) {
    lVar16 = (long)dgd8 * 2;
    lVar41 = (long)dgd_stride;
    if (v_start < v_end) {
      lVar20 = (long)v_start;
      lVar36 = lVar16 + lVar41 * lVar20 * 2;
      uVar10 = 0;
      do {
        lVar39 = (long)h_start;
        if (h_start < h_end) {
          do {
            uVar10 = uVar10 + *(ushort *)(lVar36 + lVar39 * 2);
            lVar39 = lVar39 + 1;
          } while (h_end != lVar39);
        }
        lVar20 = lVar20 + 1;
        lVar36 = lVar36 + lVar41 * 2;
      } while (lVar20 != v_end);
    }
    else {
      uVar10 = 0;
    }
    uVar43 = (ulong)((v_end - v_start) * (h_end - h_start));
    memset(local_57c0,0,0x188);
    memset(local_5620,0,0x55c0);
    local_5800 = 0;
    uStack_57f8 = 0;
    uStack_57f0 = 0;
    uStack_57e8 = 0;
    local_5820 = 0;
    uStack_5818 = 0;
    uStack_5810 = 0;
    uStack_5808 = 0;
    local_5840 = 0;
    uStack_5838 = 0;
    uStack_5830 = 0;
    uStack_5828 = 0;
    local_58a0[0x10] = 0;
    local_58a0[0x11] = 0;
    local_58a0[0x12] = 0;
    local_58a0[0x13] = 0;
    local_58a0[0x14] = 0;
    local_58a0[0x15] = 0;
    local_58a0[0x16] = 0;
    local_58a0[0x17] = 0;
    local_58a0[8] = 0;
    local_58a0[9] = 0;
    local_58a0[10] = 0;
    local_58a0[0xb] = 0;
    local_58a0[0xc] = 0;
    local_58a0[0xd] = 0;
    local_58a0[0xe] = 0;
    local_58a0[0xf] = 0;
    local_58a0[0] = 0;
    local_58a0[1] = 0;
    local_58a0[2] = 0;
    local_58a0[3] = 0;
    local_58a0[4] = 0;
    local_58a0[5] = 0;
    local_58a0[6] = 0;
    local_58a0[7] = 0;
    local_57e0 = 0;
    iVar18 = 0;
    if (v_start < v_end) {
      lVar27 = (long)v_start;
      lVar20 = (long)(dgd_stride * 3);
      lVar32 = (long)(dgd_stride * 2);
      lVar11 = (long)(dgd_stride * 4);
      lVar12 = (long)(dgd_stride * 5);
      lVar39 = (long)(dgd_stride * 6);
      local_5910 = (long)h_start * 2 + lVar41 * lVar27 * 2 + lVar20 * -2 + -6 + lVar16;
      local_5918 = lVar41 * lVar27 * 2 + lVar20 * -2 + lVar16 + -6;
      lVar36 = lVar41 * 2;
      iVar18 = 0;
      do {
        iVar26 = (int)lVar27;
        iVar8 = v_end - iVar26;
        if (iVar8 != 0 && iVar26 <= v_end) {
          if (0x3f < iVar8) {
            iVar8 = 0x40;
          }
          lVar15 = lVar27;
          lVar22 = local_5910;
          lVar38 = local_5918;
          do {
            lVar14 = lVar16 + lVar20 * -2 + -6 + lVar15 * lVar41 * 2;
            lVar37 = (long)src8 * 2 + lVar15 * src_stride * 2;
            lVar13 = lVar22;
            uVar33 = (long)h_start;
            if (h_start < (int)(h_end & 0xfffffffeU)) {
              do {
                uVar4 = *(ushort *)(lVar37 + uVar33 * 2);
                uVar5 = *(ushort *)(lVar37 + 2 + uVar33 * 2);
                pauVar1 = (undefined1 (*) [16])(lVar14 + uVar33 * 2);
                auVar44._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + 8) + ZEXT116(1) * *pauVar1;
                auVar44._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + 8);
                auVar46 = vpshufb_avx2(auVar44,_DAT_00512200);
                auVar48._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar41 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar41 * 2);
                auVar48._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar41 * 2 + 8);
                auVar50 = vpshufb_avx2(auVar48,_DAT_00512200);
                auVar52._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2);
                auVar52._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2 + 8);
                auVar54 = vpshufb_avx2(auVar52,_DAT_00512200);
                auVar56._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2);
                auVar56._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2 + 8);
                auVar58 = vpshufb_avx2(auVar56,_DAT_00512200);
                auVar60._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2);
                auVar60._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8);
                auVar62 = vpshufb_avx2(auVar60,_DAT_00512200);
                auVar64._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2);
                auVar64._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2 + 8);
                auVar47 = vpshufb_avx2(auVar64,_DAT_00512200);
                auVar68._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2 + 8) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2);
                auVar68._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2 + 8);
                auVar51 = vpshufb_avx2(auVar68,_DAT_00512200);
                pauVar17 = (undefined1 (*) [32])local_5480;
                piVar29 = local_58a0;
                plVar30 = local_57c0;
                lVar40 = 0;
                lVar21 = lVar13;
                do {
                  lVar28 = 0;
                  pauVar19 = pauVar17;
                  do {
                    uVar6 = *(ushort *)(lVar21 + lVar28);
                    uVar7 = *(ushort *)(lVar21 + 2 + lVar28);
                    piVar34 = (int *)((long)piVar29 + lVar28 * 2);
                    *piVar34 = *piVar34 + (uint)uVar7 + (uint)uVar6;
                    uVar35 = (uint)uVar4;
                    uVar9 = (uint)uVar5;
                    plVar2 = (long *)((long)plVar30 + lVar28 * 4);
                    *plVar2 = *plVar2 + (ulong)(uVar7 * uVar9 + uVar6 * uVar35);
                    uVar3 = *(undefined4 *)(lVar21 + lVar28);
                    auVar70._4_4_ = uVar3;
                    auVar70._0_4_ = uVar3;
                    auVar70._8_4_ = uVar3;
                    auVar70._12_4_ = uVar3;
                    auVar70._16_4_ = uVar3;
                    auVar70._20_4_ = uVar3;
                    auVar70._24_4_ = uVar3;
                    auVar70._28_4_ = uVar3;
                    auVar55 = vpmaddwd_avx2(auVar70,auVar46);
                    auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-0xd]);
                    pauVar19[-0xd] = auVar66;
                    auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-0xc]);
                    pauVar19[-0xc] = auVar66;
                    auVar55 = vpmaddwd_avx2(auVar70,auVar50);
                    auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-0xb]);
                    pauVar19[-0xb] = auVar66;
                    auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-10]);
                    pauVar19[-10] = auVar66;
                    auVar55 = vpmaddwd_avx2(auVar70,auVar54);
                    auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-9]);
                    pauVar19[-9] = auVar66;
                    auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-8]);
                    pauVar19[-8] = auVar66;
                    auVar55 = vpmaddwd_avx2(auVar70,auVar58);
                    auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-7]);
                    pauVar19[-7] = auVar66;
                    auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-6]);
                    pauVar19[-6] = auVar66;
                    auVar55 = vpmaddwd_avx2(auVar70,auVar62);
                    auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-5]);
                    pauVar19[-5] = auVar66;
                    auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-4]);
                    pauVar19[-4] = auVar66;
                    auVar55 = vpmaddwd_avx2(auVar70,auVar47);
                    auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-3]);
                    pauVar19[-3] = auVar66;
                    auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-2]);
                    pauVar19[-2] = auVar66;
                    auVar55 = vpmaddwd_avx2(auVar70,auVar51);
                    auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                    auVar66 = vpaddq_avx2(auVar66,pauVar19[-1]);
                    pauVar19[-1] = auVar66;
                    auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                    auVar66 = vpaddq_avx2(auVar66,*pauVar19);
                    *pauVar19 = auVar66;
                    lVar28 = lVar28 + 2;
                    pauVar19 = pauVar19 + 0x62;
                  } while (lVar28 != 0xe);
                  lVar40 = lVar40 + 1;
                  plVar30 = plVar30 + 7;
                  piVar29 = piVar29 + 7;
                  lVar21 = lVar21 + lVar36;
                  pauVar17 = pauVar17 + 0xe;
                } while (lVar40 != 7);
                iVar18 = iVar18 + uVar35 + uVar9;
                uVar33 = uVar33 + 2;
                lVar13 = lVar13 + 4;
              } while ((long)uVar33 < (long)(int)(h_end & 0xfffffffeU));
            }
            else {
              uVar33 = (ulong)(uint)h_start;
            }
            if ((h_end & 1U) != 0) {
              lVar13 = (long)(int)uVar33;
              uVar4 = *(ushort *)(lVar37 + lVar13 * 2);
              pauVar1 = (undefined1 (*) [16])(lVar14 + lVar13 * 2);
              auVar45._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + 8) + ZEXT116(1) * *pauVar1;
              auVar45._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + 8);
              auVar46 = vpshufb_avx2(auVar45,_DAT_00512200);
              auVar49._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar41 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar41 * 2);
              auVar49._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar41 * 2 + 8);
              auVar50 = vpshufb_avx2(auVar49,_DAT_00512200);
              auVar53._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2);
              auVar53._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar32 * 2 + 8);
              auVar54 = vpshufb_avx2(auVar53,_DAT_00512200);
              auVar57._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2);
              auVar57._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar20 * 2 + 8);
              auVar58 = vpshufb_avx2(auVar57,_DAT_00512200);
              auVar61._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2);
              auVar61._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar11 * 2 + 8);
              auVar62 = vpshufb_avx2(auVar61,_DAT_00512200);
              auVar65._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2);
              auVar65._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar12 * 2 + 8);
              auVar47 = vpshufb_avx2(auVar65,_DAT_00512200);
              auVar69._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2 + 8) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2);
              auVar69._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar1 + lVar39 * 2 + 8);
              auVar51 = vpshufb_avx2(auVar69,_DAT_00512200);
              lVar14 = lVar38 + lVar13 * 2;
              pauVar17 = (undefined1 (*) [32])local_5480;
              piVar29 = local_58a0;
              plVar30 = local_57c0;
              lVar37 = 0;
              do {
                lVar13 = 0;
                pauVar19 = pauVar17;
                do {
                  uVar5 = *(ushort *)(lVar14 + lVar13);
                  piVar34 = (int *)((long)piVar29 + lVar13 * 2);
                  *piVar34 = *piVar34 + CONCAT22(0,uVar5);
                  uVar9 = (uint)uVar4;
                  plVar2 = (long *)((long)plVar30 + lVar13 * 4);
                  *plVar2 = *plVar2 + (ulong)(uVar5 * uVar9);
                  auVar71._4_2_ = uVar5;
                  auVar71._0_4_ = CONCAT22(0,uVar5);
                  auVar71._6_2_ = 0;
                  auVar71._8_2_ = uVar5;
                  auVar71._10_2_ = 0;
                  auVar71._12_2_ = uVar5;
                  auVar71._14_2_ = 0;
                  auVar71._16_2_ = uVar5;
                  auVar71._18_2_ = 0;
                  auVar71._20_2_ = uVar5;
                  auVar71._22_2_ = 0;
                  auVar71._24_2_ = uVar5;
                  auVar71._26_2_ = 0;
                  auVar71._28_2_ = uVar5;
                  auVar71._30_2_ = 0;
                  auVar55 = vpmaddwd_avx2(auVar71,auVar46);
                  auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-0xd]);
                  pauVar19[-0xd] = auVar66;
                  auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-0xc]);
                  pauVar19[-0xc] = auVar66;
                  auVar55 = vpmaddwd_avx2(auVar71,auVar50);
                  auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-0xb]);
                  pauVar19[-0xb] = auVar66;
                  auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-10]);
                  pauVar19[-10] = auVar66;
                  auVar55 = vpmaddwd_avx2(auVar71,auVar54);
                  auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-9]);
                  pauVar19[-9] = auVar66;
                  auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-8]);
                  pauVar19[-8] = auVar66;
                  auVar55 = vpmaddwd_avx2(auVar71,auVar58);
                  auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-7]);
                  pauVar19[-7] = auVar66;
                  auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-6]);
                  pauVar19[-6] = auVar66;
                  auVar55 = vpmaddwd_avx2(auVar71,auVar62);
                  auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-5]);
                  pauVar19[-5] = auVar66;
                  auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-4]);
                  pauVar19[-4] = auVar66;
                  auVar55 = vpmaddwd_avx2(auVar71,auVar47);
                  auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-3]);
                  pauVar19[-3] = auVar66;
                  auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-2]);
                  pauVar19[-2] = auVar66;
                  auVar55 = vpmaddwd_avx2(auVar71,auVar51);
                  auVar66 = vpmovzxdq_avx2(auVar55._0_16_);
                  auVar66 = vpaddq_avx2(auVar66,pauVar19[-1]);
                  pauVar19[-1] = auVar66;
                  auVar66 = vpmovzxdq_avx2(auVar55._16_16_);
                  auVar66 = vpaddq_avx2(auVar66,*pauVar19);
                  *pauVar19 = auVar66;
                  lVar13 = lVar13 + 2;
                  pauVar19 = pauVar19 + 0x62;
                } while (lVar13 != 0xe);
                lVar37 = lVar37 + 1;
                plVar30 = plVar30 + 7;
                piVar29 = piVar29 + 7;
                lVar14 = lVar14 + lVar36;
                pauVar17 = pauVar17 + 0xe;
              } while (lVar37 != 7);
              iVar18 = iVar18 + uVar9;
            }
            lVar15 = lVar15 + 1;
            lVar22 = lVar22 + lVar36;
            lVar38 = lVar38 + lVar36;
          } while (lVar15 < iVar8 + iVar26);
        }
        lVar27 = lVar27 + 0x40;
        local_5910 = local_5910 + lVar41 * 0x80;
        local_5918 = local_5918 + lVar41 * 0x80;
      } while ((int)lVar27 < v_end);
    }
    lVar16 = 0x10;
    if (bit_depth != AOM_BITS_12) {
      lVar16 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
    }
    uVar10 = uVar10 / uVar43 & 0xffff;
    lVar36 = uVar43 * uVar10 * uVar10;
    lVar41 = 0;
    puVar25 = local_5620;
    do {
      lVar20 = 0;
      puVar24 = puVar25;
      piVar31 = H;
      do {
        iVar8 = local_58a0[lVar41 * 7 + lVar20];
        M[lVar20 * 7 + lVar41] =
             (long)((local_57c0[lVar41 * 7 + lVar20] + lVar36) -
                   ((long)iVar18 + (long)iVar8) * uVar10) / lVar16;
        piVar29 = local_58a0;
        lVar39 = 0;
        puVar23 = puVar24;
        piVar42 = piVar31;
        do {
          lVar11 = 0;
          piVar34 = piVar29;
          do {
            *(long *)((long)piVar42 + lVar11) =
                 (long)((*(long *)(puVar23 + lVar11 * 8) + lVar36) -
                       ((long)*piVar34 + (long)iVar8) * uVar10) / lVar16;
            lVar11 = lVar11 + 8;
            piVar34 = piVar34 + 7;
          } while (lVar11 != 0x38);
          lVar39 = lVar39 + 1;
          piVar42 = piVar42 + 7;
          piVar29 = piVar29 + 1;
          puVar23 = puVar23 + 8;
        } while (lVar39 != 7);
        lVar20 = lVar20 + 1;
        piVar31 = piVar31 + 0x157;
        puVar24 = puVar24 + 0xc40;
      } while (lVar20 != 7);
      lVar41 = lVar41 + 1;
      H = H + 0x31;
      puVar25 = puVar25 + 0x1c0;
    } while (lVar41 != 7);
  }
  else {
    av1_compute_stats_highbd_c
              (wiener_win,dgd8,src8,dgd_avg,src_avg,h_start,h_end,v_start,v_end,dgd_stride,
               src_stride,M,H,bit_depth);
  }
  return;
}

Assistant:

void av1_compute_stats_highbd_avx2(int wiener_win, const uint8_t *dgd8,
                                   const uint8_t *src8, int16_t *dgd_avg,
                                   int16_t *src_avg, int h_start, int h_end,
                                   int v_start, int v_end, int dgd_stride,
                                   int src_stride, int64_t *M, int64_t *H,
                                   aom_bit_depth_t bit_depth) {
  if (wiener_win == WIENER_WIN) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win7_opt_avx2(dgd8, src8, h_start, h_end, v_start,
                                       v_end, dgd_stride, src_stride, M, H,
                                       bit_depth);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win5_opt_avx2(dgd8, src8, h_start, h_end, v_start,
                                       v_end, dgd_stride, src_stride, M, H,
                                       bit_depth);
  } else {
    av1_compute_stats_highbd_c(wiener_win, dgd8, src8, dgd_avg, src_avg,
                               h_start, h_end, v_start, v_end, dgd_stride,
                               src_stride, M, H, bit_depth);
  }
}